

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathNodeSetGrow(xmlNodeSetPtr cur)

{
  xmlNodePtr *ppxVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  iVar2 = cur->nodeMax;
  if (iVar2 < 1) {
    uVar4 = 10;
  }
  else {
    uVar4 = 0xffffffff;
    if (iVar2 < 10000000) {
      uVar3 = iVar2 + 1U >> 1;
      uVar4 = uVar3 + iVar2;
      if ((int)(10000000 - uVar3) < iVar2) {
        uVar4 = 10000000;
      }
    }
  }
  iVar2 = -1;
  if ((-1 < (int)uVar4) &&
     (ppxVar1 = (xmlNodePtr *)(*xmlRealloc)(cur->nodeTab,(ulong)uVar4 << 3),
     ppxVar1 != (xmlNodePtr *)0x0)) {
    cur->nodeMax = uVar4;
    cur->nodeTab = ppxVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
xmlXPathNodeSetGrow(xmlNodeSetPtr cur) {
    xmlNodePtr *temp;
    int newSize;

    newSize = xmlGrowCapacity(cur->nodeMax, sizeof(temp[0]),
                              XML_NODESET_DEFAULT, XPATH_MAX_NODESET_LENGTH);
    if (newSize < 0)
        return(-1);
    temp = xmlRealloc(cur->nodeTab, newSize * sizeof(temp[0]));
    if (temp == NULL)
        return(-1);
    cur->nodeMax = newSize;
    cur->nodeTab = temp;

    return(0);
}